

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O3

void google::protobuf::internal::WireFormatLite::WriteEnum
               (int field_number,int value,CodedOutputStream *output)

{
  bool bVar1;
  byte *pbVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  
  uVar5 = field_number << 3;
  pbVar2 = output->cur_;
  if ((output->impl_).end_ <= pbVar2) {
    pbVar2 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar2);
  }
  uVar6 = uVar5;
  if (0x7f < uVar5) {
    do {
      *pbVar2 = (byte)uVar6 | 0x80;
      uVar5 = uVar6 >> 7;
      pbVar2 = pbVar2 + 1;
      bVar1 = 0x3fff < uVar6;
      uVar6 = uVar5;
    } while (bVar1);
  }
  *pbVar2 = (byte)uVar5;
  pbVar2 = pbVar2 + 1;
  output->cur_ = pbVar2;
  if ((output->impl_).end_ <= pbVar2) {
    pbVar2 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar2);
  }
  uVar3 = (ulong)value;
  uVar4 = uVar3;
  if (0x7f < (uint)value) {
    do {
      *pbVar2 = (byte)uVar4 | 0x80;
      uVar3 = uVar4 >> 7;
      pbVar2 = pbVar2 + 1;
      bVar1 = 0x3fff < uVar4;
      uVar4 = uVar3;
    } while (bVar1);
  }
  *pbVar2 = (byte)uVar3;
  output->cur_ = pbVar2 + 1;
  return;
}

Assistant:

void WireFormatLite::WriteEnum(int field_number, int value,
                               io::CodedOutputStream* output) {
  WriteTag(field_number, WIRETYPE_VARINT, output);
  WriteEnumNoTag(value, output);
}